

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall SFFile::TranslatePercussionPreset(SFFile *this,SFPreset *preset)

{
  uint local_8c;
  bool has_global;
  int i;
  SFPerc perc;
  SFPreset *preset_local;
  SFFile *this_local;
  
  for (local_8c = (uint)preset->BagIndex; (int)local_8c < (int)(uint)preset[1].BagIndex;
      local_8c = local_8c + 1) {
    if (((-1 < this->PresetBags[(int)local_8c].Target) &&
        (this->PresetBags[(int)local_8c].KeyRange.Lo < 0x80)) &&
       (this->PresetBags[(int)local_8c].VelRange.Lo < 0x80)) {
      TranslatePercussionPresetZone(this,preset,this->PresetBags + (int)local_8c);
    }
  }
  return;
}

Assistant:

void SFFile::TranslatePercussionPreset(SFPreset *preset)
{
	SFPerc perc;
	int i;
	bool has_global;
	
	perc.LoadOrder = preset->LoadOrder;
	i = preset->BagIndex;
	has_global = false;

	for (i = preset->BagIndex; i < (preset + 1)->BagIndex; ++i)
	{
		if (PresetBags[i].Target < 0)
		{ // This preset zone has no instrument.
			continue;
		}
		if (PresetBags[i].KeyRange.Lo > 127 || PresetBags[i].VelRange.Lo > 127)
		{ // This preset zone is inaccesible.
			continue;
		}
		TranslatePercussionPresetZone(preset, &PresetBags[i]);
	}
}